

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

int AF__PlayerInfo_PoisonPlayer
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *player;
  bool bVar1;
  int iVar2;
  AActor *source;
  char *pcVar3;
  AActor *poisoner;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
LAB_0040a6df:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6d8,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
    pcVar3 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_0040a6df;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0040a6fe;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0040a6bd:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0040a6fe:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6d9,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  player = (player_t *)(param->field_0).field_1.a;
  poisoner = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (poisoner == (AActor *)0x0) goto LAB_0040a616;
    bVar1 = DObject::IsKindOf((DObject *)poisoner,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "poisoner == NULL || poisoner->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0040a6fe;
    }
  }
  else {
    if (poisoner != (AActor *)0x0) goto LAB_0040a6bd;
LAB_0040a616:
    poisoner = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0040a71d;
  }
  if (param[2].field_0.field_3.Type == '\x03') {
    source = (AActor *)param[2].field_0.field_1.a;
    if (param[2].field_0.field_1.atag == 1) {
      if (source != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar3 = "source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0040a71d;
        }
        goto LAB_0040a667;
      }
    }
    else if (source != (AActor *)0x0) goto LAB_0040a6c6;
    source = (AActor *)0x0;
LAB_0040a667:
    if (numparam == 3) {
      pcVar3 = "(paramnum) < numparam";
    }
    else {
      if (param[3].field_0.field_3.Type == '\0') {
        bVar1 = P_PoisonPlayer(player,poisoner,source,param[3].field_0.i);
        if (numret < 1) {
          iVar2 = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                          ,0x6dc,
                          "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,(uint)bVar1);
          iVar2 = 1;
        }
        return iVar2;
      }
      pcVar3 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x6db,
                  "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0040a6c6:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0040a71d:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                ,0x6da,
                "int AF__PlayerInfo_PoisonPlayer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(_PlayerInfo, PoisonPlayer)
{
	PARAM_SELF_STRUCT_PROLOGUE(player_t);
	PARAM_OBJECT(poisoner, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(poison);
	ACTION_RETURN_BOOL(P_PoisonPlayer(self, poisoner, source, poison));
}